

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

string * __thiscall
NDeviceChannel::getPrintStr_abi_cxx11_
          (string *__return_storage_ptr__,NDeviceChannel *this,int indent)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  string indentStr;
  ostringstream oss;
  allocator local_1c9;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::string::string(local_1c8,"    ",&local_1c9);
  iVar3 = 0;
  if (0 < indent) {
    iVar3 = indent;
  }
  iVar2 = iVar3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  std::operator<<((ostream *)local_1a8,"Printing \'NDevice Channel\'\n");
  iVar2 = iVar3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"    -id                  : ");
  poVar1 = std::operator<<(poVar1,(string *)&this->id);
  std::operator<<(poVar1,"\n");
  iVar2 = iVar3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"    -startByte           : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->startByte);
  std::operator<<(poVar1,"\n");
  iVar2 = iVar3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"    -startBit           : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->startBit);
  std::operator<<(poVar1,"\n");
  iVar2 = iVar3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"    -type                : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->type);
  std::operator<<(poVar1,"\n");
  iVar2 = iVar3;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"    -interleavedDataByte : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->interleavedDataByte);
  std::operator<<(poVar1,"\n");
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"    -interleavedDataBit  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->interleavedDataBit);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string NDeviceChannel::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "Printing 'NDevice Channel'\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -id                  : " << id << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -startByte           : " << startByte << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -startBit           : " << startBit << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -type                : " << type << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -interleavedDataByte : " << interleavedDataByte << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -interleavedDataBit  : " << interleavedDataBit << "\n";
    return(oss.str());
}